

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::array_literal_expression,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
          (parser *this,
          vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
          *args)

{
  pointer puVar1;
  element_type *this_00;
  expression *peVar2;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  *in_RDX;
  source_extend local_38;
  
  puVar1 = args[4].
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != (pointer)0x0) {
    this_00 = (element_type *)operator_new(0x38);
    peVar2 = (puVar1->_M_t).
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(peVar2->super_syntax_node)._vptr_syntax_node;
    local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(peVar2->super_syntax_node).extend_.file.
             super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>;
    if (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        peVar2 = (puVar1->_M_t).
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      }
      else {
        (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_38.start =
         *(uint32_t *)
          &puVar1[3]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    local_38.end = *(uint32_t *)((long)&peVar2[3].super_syntax_node._vptr_syntax_node + 4);
    array_literal_expression::array_literal_expression
              ((array_literal_expression *)this_00,&local_38,in_RDX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_00;
    if (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::array_literal_expression, Args = <std::vector<std::unique_ptr<mjs::expression>>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }